

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

int32_t testing::internal::Int32FromEnvOrDie(char *var,int32_t default_val)

{
  bool bVar1;
  char *str;
  size_t sVar2;
  ostream *poVar3;
  int32_t local_2c;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Stack_28;
  int32_t result;
  
  str = getenv(var);
  if (str != (char *)0x0) {
    Message::Message((Message *)&stack0xffffffffffffffd8);
    poVar3 = (ostream *)((long)_Stack_28._M_head_impl + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"The value of environment variable ",0x22);
    if (var == (char *)0x0) {
      sVar2 = 6;
      var = "(null)";
    }
    else {
      sVar2 = strlen(var);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,var,sVar2);
    bVar1 = ParseInt32((Message *)&stack0xffffffffffffffd8,str,&local_2c);
    if (_Stack_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Stack_28._M_head_impl + 8))();
    }
    default_val = local_2c;
    if (!bVar1) {
      exit(1);
    }
  }
  return default_val;
}

Assistant:

int32_t Int32FromEnvOrDie(const char* var, int32_t default_val) {
  const char* str_val = posix::GetEnv(var);
  if (str_val == nullptr) {
    return default_val;
  }

  int32_t result;
  if (!ParseInt32(Message() << "The value of environment variable " << var,
                  str_val, &result)) {
    exit(EXIT_FAILURE);
  }
  return result;
}